

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O3

shared_ptr<Instance> __thiscall Individual::getUsedInstance(Individual *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  shared_ptr<Instance> sVar2;
  shared_ptr<Instance> sVar3;
  
  (in_RDI->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
  p_Var1 = (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (in_RDI->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      sVar2.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar2.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<Instance>)sVar2.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  sVar3.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Instance>)sVar3.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instance> Individual::getUsedInstance() const {
	return usedInstance;
}